

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O3

void Gia_ManOrigIdsInit(Gia_Man_t *p)

{
  uint uVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  ulong uVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  pVVar4 = p->vIdsOrig;
  if (pVVar4 != (Vec_Int_t *)0x0) {
    if (pVVar4->pArray != (int *)0x0) {
      free(pVVar4->pArray);
      p->vIdsOrig->pArray = (int *)0x0;
      pVVar4 = p->vIdsOrig;
      if (pVVar4 == (Vec_Int_t *)0x0) goto LAB_001fc39d;
    }
    free(pVVar4);
  }
LAB_001fc39d:
  uVar1 = p->nObjs;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  uVar3 = 0x10;
  if (0xe < uVar1 - 1) {
    uVar3 = uVar1;
  }
  pVVar4->nCap = uVar3;
  if (uVar3 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc((long)(int)uVar3 << 2);
  }
  pVVar4->pArray = piVar5;
  pVVar4->nSize = uVar1;
  auVar2 = _DAT_0094e250;
  if (0 < (int)uVar1) {
    lVar7 = (ulong)uVar1 - 1;
    auVar8._8_4_ = (int)lVar7;
    auVar8._0_8_ = lVar7;
    auVar8._12_4_ = (int)((ulong)lVar7 >> 0x20);
    uVar6 = 0;
    auVar8 = auVar8 ^ _DAT_0094e250;
    auVar9 = _DAT_0094e240;
    do {
      auVar10 = auVar9 ^ auVar2;
      if ((bool)(~(auVar10._4_4_ == auVar8._4_4_ && auVar8._0_4_ < auVar10._0_4_ ||
                  auVar8._4_4_ < auVar10._4_4_) & 1)) {
        piVar5[uVar6] = (int)uVar6;
      }
      if ((auVar10._12_4_ != auVar8._12_4_ || auVar10._8_4_ <= auVar8._8_4_) &&
          auVar10._12_4_ <= auVar8._12_4_) {
        piVar5[uVar6 + 1] = (int)uVar6 + 1;
      }
      uVar6 = uVar6 + 2;
      lVar7 = auVar9._8_8_;
      auVar9._0_8_ = auVar9._0_8_ + 2;
      auVar9._8_8_ = lVar7 + 2;
    } while ((uVar1 + 1 & 0xfffffffe) != uVar6);
  }
  p->vIdsOrig = pVVar4;
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Manipulating original IDs.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Gia_ManOrigIdsInit( Gia_Man_t * p )
{
    Vec_IntFreeP( &p->vIdsOrig );
    p->vIdsOrig = Vec_IntStartNatural( Gia_ManObjNum(p) );
}